

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall QStyleSheetStyle::setGeometry(QStyleSheetStyle *this,QWidget *w)

{
  int iVar1;
  QSharedDataPointer<QStyleSheetGeometryData> QVar2;
  char cVar3;
  uint uVar4;
  quint64 qVar5;
  QSize QVar6;
  uint uVar7;
  long in_FS_OFFSET;
  QRenderRule rule;
  QRenderRule local_d0;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_d0,0xaa,0x88);
  qVar5 = extendedPseudoClass(w);
  renderRule(&local_d0,this,&w->super_QObject,0,qVar5 | 1);
  QVar2.d.ptr = local_d0.geo.d.ptr;
  QObject::property((char *)local_48.data);
  cVar3 = ::QVariant::toBool();
  if (cVar3 == '\0') {
LAB_0035ac96:
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  else {
    if (local_d0.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
      ::QVariant::~QVariant((QVariant *)&local_48);
LAB_0035ac55:
      QWidget::setMinimumWidth(w,0);
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
      local_30 = 2;
      QObject::doSetProperty((char *)w,(QVariant *)"_q_stylesheet_minw",(QVariant *)&local_48);
      goto LAB_0035ac96;
    }
    iVar1 = *(int *)((long)QVar2.d.ptr + 4);
    ::QVariant::~QVariant((QVariant *)&local_48);
    if (iVar1 == -1) goto LAB_0035ac55;
  }
  QObject::property((char *)local_48.data);
  cVar3 = ::QVariant::toBool();
  if (cVar3 == '\0') {
LAB_0035ad39:
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  else {
    if (local_d0.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
      ::QVariant::~QVariant((QVariant *)&local_48);
LAB_0035acf8:
      QWidget::setMinimumHeight(w,0);
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
      local_30 = 2;
      QObject::doSetProperty((char *)w,(QVariant *)"_q_stylesheet_minh",(QVariant *)&local_48);
      goto LAB_0035ad39;
    }
    iVar1 = *(int *)((long)QVar2.d.ptr + 8);
    ::QVariant::~QVariant((QVariant *)&local_48);
    if (iVar1 == -1) goto LAB_0035acf8;
  }
  QObject::property((char *)local_48.data);
  cVar3 = ::QVariant::toBool();
  if (cVar3 == '\0') {
LAB_0035addf:
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  else {
    if (local_d0.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
      ::QVariant::~QVariant((QVariant *)&local_48);
LAB_0035ad9b:
      QWidget::setMaximumWidth(w,0xffffff);
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
      local_30 = 2;
      QObject::doSetProperty((char *)w,(QVariant *)"_q_stylesheet_maxw",(QVariant *)&local_48);
      goto LAB_0035addf;
    }
    iVar1 = *(int *)((long)QVar2.d.ptr + 0x14);
    ::QVariant::~QVariant((QVariant *)&local_48);
    if (iVar1 == -1) goto LAB_0035ad9b;
  }
  QObject::property((char *)local_48.data);
  cVar3 = ::QVariant::toBool();
  if (cVar3 != '\0') {
    if (local_d0.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
    else {
      iVar1 = *(int *)((long)QVar2.d.ptr + 0x18);
      ::QVariant::~QVariant((QVariant *)&local_48);
      if (iVar1 != -1) goto LAB_0035ae8a;
    }
    QWidget::setMaximumHeight(w,0xffffff);
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    local_30 = 2;
    QObject::doSetProperty((char *)w,(QVariant *)"_q_stylesheet_maxh",(QVariant *)&local_48);
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
LAB_0035ae8a:
  if (local_d0.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
    if (*(int *)((long)QVar2.d.ptr + 4) != -1) {
      ::QVariant::QVariant((QVariant *)&local_48,true);
      QObject::doSetProperty((char *)w,(QVariant *)"_q_stylesheet_minw",(QVariant *)&local_48);
      ::QVariant::~QVariant((QVariant *)&local_48);
      local_48._0_4_ = *(int *)((long)QVar2.d.ptr + 4);
      if (*(int *)((long)QVar2.d.ptr + 4) < *(int *)((long)QVar2.d.ptr + 0xc)) {
        local_48._0_4_ = *(int *)((long)QVar2.d.ptr + 0xc);
      }
      local_48._4_4_ = 0;
      QVar6 = QRenderRule::boxSize(&local_d0,(QSize *)&local_48.shared,7);
      QWidget::setMinimumWidth(w,QVar6.wd.m_i.m_i);
    }
    if (*(int *)((long)QVar2.d.ptr + 8) != -1) {
      ::QVariant::QVariant((QVariant *)&local_48,true);
      QObject::doSetProperty((char *)w,(QVariant *)"_q_stylesheet_minh",(QVariant *)&local_48);
      ::QVariant::~QVariant((QVariant *)&local_48);
      uVar4 = *(int *)((long)QVar2.d.ptr + 8);
      if (*(int *)((long)QVar2.d.ptr + 8) < *(int *)((long)QVar2.d.ptr + 0x10)) {
        uVar4 = *(int *)((long)QVar2.d.ptr + 0x10);
      }
      local_48.shared = (PrivateShared *)((ulong)uVar4 << 0x20);
      QVar6 = QRenderRule::boxSize(&local_d0,(QSize *)&local_48.shared,7);
      QWidget::setMinimumHeight(w,QVar6.ht.m_i.m_i);
    }
    if (*(int *)((long)QVar2.d.ptr + 0x14) != -1) {
      ::QVariant::QVariant((QVariant *)&local_48,true);
      QObject::doSetProperty((char *)w,(QVariant *)"_q_stylesheet_maxw",(QVariant *)&local_48);
      ::QVariant::~QVariant((QVariant *)&local_48);
      uVar4 = *(int *)((long)QVar2.d.ptr + 0xc);
      local_48._0_4_ = *(int *)((long)QVar2.d.ptr + 0x14);
      if (uVar4 == 0xffffffff) {
        uVar4 = 0xffffff;
      }
      if (local_48._0_4_ == 0xffffffff) {
        local_48._0_4_ = 0xffffff;
      }
      if ((int)uVar4 < (int)local_48._0_4_) {
        local_48._0_4_ = uVar4;
      }
      local_48._4_4_ = 0;
      QVar6 = QRenderRule::boxSize(&local_d0,(QSize *)&local_48.shared,7);
      QWidget::setMaximumWidth(w,QVar6.wd.m_i.m_i);
    }
    if (*(int *)((long)QVar2.d.ptr + 0x18) != -1) {
      ::QVariant::QVariant((QVariant *)&local_48,true);
      QObject::doSetProperty((char *)w,(QVariant *)"_q_stylesheet_maxh",(QVariant *)&local_48);
      ::QVariant::~QVariant((QVariant *)&local_48);
      uVar4 = *(int *)((long)QVar2.d.ptr + 0x10);
      uVar7 = *(int *)((long)QVar2.d.ptr + 0x18);
      if (uVar4 == 0xffffffff) {
        uVar4 = 0xffffff;
      }
      if (uVar7 == 0xffffffff) {
        uVar7 = 0xffffff;
      }
      if ((int)uVar4 < (int)uVar7) {
        uVar7 = uVar4;
      }
      local_48.shared = (PrivateShared *)((ulong)uVar7 << 0x20);
      QVar6 = QRenderRule::boxSize(&local_d0,(QSize *)&local_48.shared,7);
      QWidget::setMaximumHeight(w,QVar6.ht.m_i.m_i);
    }
  }
  QPainterPath::~QPainterPath(&local_d0.clipPath);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_d0.iconPtr);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_d0.img);
  if (local_d0.p.d.ptr != (QStyleSheetPositionData *)0x0) {
    LOCK();
    *(int *)local_d0.p.d.ptr = *(int *)local_d0.p.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_d0.p.d.ptr == 0) && (local_d0.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
      operator_delete((void *)local_d0.p.d.ptr,0x24);
    }
  }
  if (local_d0.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    *(int *)local_d0.geo.d.ptr = *(int *)local_d0.geo.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_d0.geo.d.ptr == 0) && (local_d0.geo.d.ptr != (QStyleSheetGeometryData *)0x0))
    {
      operator_delete((void *)local_d0.geo.d.ptr,0x1c);
    }
  }
  QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_d0.ou);
  QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_d0.bd);
  QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_d0.bg);
  if (local_d0.b.d.ptr != (QStyleSheetBoxData *)0x0) {
    LOCK();
    *(int *)local_d0.b.d.ptr = *(int *)local_d0.b.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_d0.b.d.ptr == 0) && (local_d0.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
      operator_delete((void *)local_d0.b.d.ptr,0x28);
    }
  }
  QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_d0.pal);
  QHash<QString,_QVariant>::~QHash(&local_d0.styleHints);
  QFont::~QFont(&local_d0.font);
  QBrush::~QBrush(&local_d0.defaultBackground);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStyleSheetStyle::setGeometry(QWidget *w)
{
    QRenderRule rule = renderRule(w, PseudoElement_None, PseudoClass_Enabled | extendedPseudoClass(w));
    const QStyleSheetGeometryData *geo = rule.geometry();
    if (w->property("_q_stylesheet_minw").toBool()
        && ((!rule.hasGeometry() || geo->minWidth == -1))) {
            w->setMinimumWidth(0);
            w->setProperty("_q_stylesheet_minw", QVariant());
    }
    if (w->property("_q_stylesheet_minh").toBool()
        && ((!rule.hasGeometry() || geo->minHeight == -1))) {
            w->setMinimumHeight(0);
            w->setProperty("_q_stylesheet_minh", QVariant());
    }
    if (w->property("_q_stylesheet_maxw").toBool()
        && ((!rule.hasGeometry() || geo->maxWidth == -1))) {
            w->setMaximumWidth(QWIDGETSIZE_MAX);
            w->setProperty("_q_stylesheet_maxw", QVariant());
    }
   if (w->property("_q_stylesheet_maxh").toBool()
        && ((!rule.hasGeometry() || geo->maxHeight == -1))) {
            w->setMaximumHeight(QWIDGETSIZE_MAX);
            w->setProperty("_q_stylesheet_maxh", QVariant());
    }


    if (rule.hasGeometry()) {
        if (geo->minWidth != -1) {
            w->setProperty("_q_stylesheet_minw", true);
            w->setMinimumWidth(rule.boxSize(QSize(qMax(geo->width, geo->minWidth), 0)).width());
        }
        if (geo->minHeight != -1) {
            w->setProperty("_q_stylesheet_minh", true);
            w->setMinimumHeight(rule.boxSize(QSize(0, qMax(geo->height, geo->minHeight))).height());
        }
        if (geo->maxWidth != -1) {
            w->setProperty("_q_stylesheet_maxw", true);
            w->setMaximumWidth(rule.boxSize(QSize(qMin(geo->width == -1 ? QWIDGETSIZE_MAX : geo->width,
                                                       geo->maxWidth == -1 ? QWIDGETSIZE_MAX : geo->maxWidth), 0)).width());
        }
        if (geo->maxHeight != -1) {
            w->setProperty("_q_stylesheet_maxh", true);
            w->setMaximumHeight(rule.boxSize(QSize(0, qMin(geo->height == -1 ? QWIDGETSIZE_MAX : geo->height,
                                                       geo->maxHeight == -1 ? QWIDGETSIZE_MAX : geo->maxHeight))).height());
        }
    }
}